

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_skies.cpp
# Opt level: O0

void __thiscall ASkyPicker::PostBeginPlay(ASkyPicker *this)

{
  uint uVar1;
  int iVar2;
  undefined1 local_28 [4];
  int boxindex;
  TActorIterator<ASkyViewpoint> iterator;
  ASkyViewpoint *box;
  ASkyPicker *this_local;
  
  AActor::PostBeginPlay(&this->super_AActor);
  if ((this->super_AActor).args[0] == 0) {
    iterator.super_FActorIterator.id = 0;
    iterator.super_FActorIterator._12_4_ = 0;
  }
  else {
    TActorIterator<ASkyViewpoint>::TActorIterator
              ((TActorIterator<ASkyViewpoint> *)local_28,(this->super_AActor).args[0]);
    iterator.super_FActorIterator._8_8_ =
         TActorIterator<ASkyViewpoint>::Next((TActorIterator<ASkyViewpoint> *)local_28);
  }
  if ((iterator.super_FActorIterator._8_8_ == 0) && ((this->super_AActor).args[0] != 0)) {
    Printf("Can\'t find SkyViewpoint %d for sector %td\n",(ulong)(uint)(this->super_AActor).args[0],
           ((long)(this->super_AActor).Sector - (long)sectors) / 0x218);
  }
  else {
    uVar1 = P_GetSkyboxPortal((ASkyViewpoint *)iterator.super_FActorIterator._8_8_);
    if ((((this->super_AActor).args[1] & 2U) == 0) &&
       (iVar2 = sector_t::GetPortalType((this->super_AActor).Sector,1), iVar2 == 0)) {
      ((this->super_AActor).Sector)->Portals[1] = uVar1;
    }
    if ((((this->super_AActor).args[1] & 1U) == 0) &&
       (iVar2 = sector_t::GetPortalType((this->super_AActor).Sector,0), iVar2 == 0)) {
      ((this->super_AActor).Sector)->Portals[0] = uVar1;
    }
  }
  (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
  return;
}

Assistant:

void ASkyPicker::PostBeginPlay ()
{
	ASkyViewpoint *box;
	Super::PostBeginPlay ();

	if (args[0] == 0)
	{
		box = NULL;
	}
	else
	{
		TActorIterator<ASkyViewpoint> iterator (args[0]);
		box = iterator.Next ();
	}

	if (box == NULL && args[0] != 0)
	{
		Printf ("Can't find SkyViewpoint %d for sector %td\n", args[0], Sector - sectors);
	}
	else
	{
		int boxindex = P_GetSkyboxPortal(box);
		// Do not override special portal types, only regular skies.
		if (0 == (args[1] & 2))
		{
			if (Sector->GetPortalType(sector_t::ceiling) == PORTS_SKYVIEWPOINT)
				Sector->Portals[sector_t::ceiling] = boxindex;
		}
		if (0 == (args[1] & 1))
		{
			if (Sector->GetPortalType(sector_t::floor) == PORTS_SKYVIEWPOINT)
				Sector->Portals[sector_t::floor] = boxindex;
		}
	}
	Destroy ();
}